

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

int slang::ast::Statement::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  SourceRange sourceRange;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax;
  bool bVar1;
  Compilation *stmtCtx;
  JumpStatementSyntax *pJVar2;
  LoopStatementSyntax *pLVar3;
  byte in_CL;
  undefined4 in_register_0000003c;
  StatementSyntax *syntax_00;
  byte in_R8B;
  StatementContext *unaff_retaddr;
  ASTContext *in_stack_00000008;
  RandCaseStatementSyntax *in_stack_00000010;
  undefined7 in_stack_00000018;
  bool in_stack_0000001f;
  CheckerInstanceStatementSyntax *in_stack_00000020;
  Compilation *in_stack_00000028;
  BlockStatementSyntax *in_stack_00000030;
  Compilation *in_stack_00000038;
  StatementContext *in_stack_00000070;
  ASTContext *in_stack_00000078;
  WaitOrderStatementSyntax *in_stack_00000080;
  Compilation *in_stack_00000088;
  ASTContext *in_stack_000000f0;
  RandSequenceStatementSyntax *in_stack_000000f8;
  Statement *block_4;
  Statement *block_3;
  Statement *block_2;
  LoopStatementSyntax *loop;
  Statement *block_1;
  JumpStatementSyntax *jump;
  Statement *result;
  Statement *block;
  Compilation *comp;
  StatementContext *in_stack_00000200;
  ASTContext *in_stack_00000208;
  ConditionalStatementSyntax *in_stack_00000210;
  Compilation *in_stack_00000218;
  StatementContext *in_stack_00000280;
  ASTContext *in_stack_00000288;
  ForLoopStatementSyntax *in_stack_00000290;
  Compilation *in_stack_00000298;
  StatementContext *in_stack_000004a0;
  ASTContext *in_stack_000004a8;
  CaseStatementSyntax *in_stack_000004b0;
  Compilation *in_stack_000004b8;
  DisableForkStatementSyntax *in_stack_fffffffffffffe78;
  Compilation *in_stack_fffffffffffffe80;
  ASTContext *in_stack_fffffffffffffe88;
  SourceLocation in_stack_fffffffffffffe90;
  SourceLocation in_stack_fffffffffffffe98;
  WaitForkStatementSyntax *in_stack_fffffffffffffea0;
  DiagCode code;
  Compilation *in_stack_fffffffffffffea8;
  TimingControlStatementSyntax *in_stack_fffffffffffffeb0;
  Compilation *in_stack_fffffffffffffeb8;
  JumpStatementSyntax *in_stack_fffffffffffffec0;
  Compilation *in_stack_fffffffffffffec8;
  Compilation *in_stack_fffffffffffffed0;
  Compilation *in_stack_fffffffffffffed8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffee0;
  Compilation *in_stack_fffffffffffffee8;
  ASTContext *in_stack_fffffffffffffef8;
  VoidCastedCallStatementSyntax *in_stack_ffffffffffffff00;
  Compilation *in_stack_ffffffffffffff08;
  ImmediateAssertionStatementSyntax *in_stack_ffffffffffffff10;
  Compilation *in_stack_ffffffffffffff18;
  ProceduralDeassignStatementSyntax *in_stack_ffffffffffffff20;
  Compilation *in_stack_ffffffffffffff28;
  StatementContext *in_stack_ffffffffffffff40;
  ASTContext *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  SyntaxKind SVar4;
  Compilation *in_stack_ffffffffffffff58;
  ReturnStatementSyntax *in_stack_ffffffffffffff60;
  Compilation *in_stack_ffffffffffffff68;
  LoopStatementSyntax *in_stack_ffffffffffffff70;
  Compilation *in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffffb0 [16];
  ConcurrentAssertionStatementSyntax *in_stack_ffffffffffffffc0;
  Compilation *in_stack_ffffffffffffffc8;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_8;
  
  syntax_00 = (StatementSyntax *)CONCAT44(in_register_0000003c,__fd);
  stmtCtx = ASTContext::getCompilation((ASTContext *)0x785852);
  if (((in_R8B & 1) == 0) && (bVar1 = hasSimpleLabel(syntax_00), bVar1)) {
    local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
              StatementContext::tryGetBlock
                        ((StatementContext *)in_stack_fffffffffffffe98,
                         (ASTContext *)in_stack_fffffffffffffe90,
                         (SyntaxNode *)in_stack_fffffffffffffe88);
    goto LAB_0078653c;
  }
  SVar4 = (syntax_00->super_SyntaxNode).kind;
  if ((SVar4 == AssertPropertyStatement) || (SVar4 == AssumePropertyStatement)) {
LAB_0078637f:
    slang::syntax::SyntaxNode::as<slang::syntax::ConcurrentAssertionStatementSyntax>
              ((SyntaxNode *)syntax_00);
    local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
              ConcurrentAssertionStatement::fromSyntax
                        (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                         in_stack_ffffffffffffffb0._8_8_,in_stack_ffffffffffffffb0._0_8_);
  }
  else if (SVar4 == BlockingEventTriggerStatement) {
LAB_007862c3:
    slang::syntax::SyntaxNode::as<slang::syntax::EventTriggerStatementSyntax>
              ((SyntaxNode *)syntax_00);
    local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
              EventTriggerStatement::fromSyntax
                        (in_stack_fffffffffffffee8,
                         (EventTriggerStatementSyntax *)in_stack_fffffffffffffee0._M_extent_value,
                         (ASTContext *)in_stack_fffffffffffffed8,
                         (StatementContext *)in_stack_fffffffffffffed0);
  }
  else if (SVar4 == CaseStatement) {
    slang::syntax::SyntaxNode::as<slang::syntax::CaseStatementSyntax>((SyntaxNode *)syntax_00);
    local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
              CaseStatement::fromSyntax
                        (in_stack_000004b8,in_stack_000004b0,in_stack_000004a8,in_stack_000004a0);
  }
  else if (SVar4 == CheckerInstanceStatement) {
    slang::syntax::SyntaxNode::as<slang::syntax::CheckerInstanceStatementSyntax>
              ((SyntaxNode *)syntax_00);
    local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
              ProceduralCheckerStatement::fromSyntax
                        (in_stack_00000028,in_stack_00000020,
                         (ASTContext *)CONCAT17(in_stack_0000001f,in_stack_00000018),
                         (StatementContext *)in_stack_00000010);
    in_stack_fffffffffffffe80 = stmtCtx;
  }
  else if (SVar4 == ConditionalStatement) {
    slang::syntax::SyntaxNode::as<slang::syntax::ConditionalStatementSyntax>
              ((SyntaxNode *)syntax_00);
    local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
              ConditionalStatement::fromSyntax
                        (in_stack_00000218,in_stack_00000210,in_stack_00000208,in_stack_00000200);
  }
  else {
    if (SVar4 - CoverPropertyStatement < 2) goto LAB_0078637f;
    if (SVar4 == DisableForkStatement) {
      slang::syntax::SyntaxNode::as<slang::syntax::DisableForkStatementSyntax>
                ((SyntaxNode *)syntax_00);
      local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                DisableForkStatement::fromSyntax
                          (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      in_stack_fffffffffffffed0 = stmtCtx;
    }
    else if (SVar4 == DisableStatement) {
      slang::syntax::SyntaxNode::as<slang::syntax::DisableStatementSyntax>((SyntaxNode *)syntax_00);
      local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                DisableStatement::fromSyntax
                          (in_stack_fffffffffffffee8,
                           (DisableStatementSyntax *)in_stack_fffffffffffffee0._M_extent_value,
                           (ASTContext *)in_stack_fffffffffffffed8);
    }
    else if (SVar4 == DoWhileStatement) {
      slang::syntax::SyntaxNode::as<slang::syntax::DoWhileStatementSyntax>((SyntaxNode *)syntax_00);
      local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                DoWhileLoopStatement::fromSyntax
                          (in_stack_ffffffffffffff58,
                           (DoWhileStatementSyntax *)CONCAT44(SVar4,in_stack_ffffffffffffff50),
                           in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    }
    else if (SVar4 == EmptyStatement) {
      slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffec0);
      code = SUB84((ulong)in_stack_fffffffffffffea0 >> 0x20,0);
      local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                BumpAllocator::emplace<slang::ast::EmptyStatement,slang::SourceRange>
                          (&in_stack_fffffffffffffe80->super_BumpAllocator,
                           (SourceRange *)in_stack_fffffffffffffe78);
      if (((in_CL & 1) != 0) &&
         (bVar1 = std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::empty
                            ((span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
                              *)0x785bdf), bVar1)) {
        slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffec0);
        sourceRange.endLoc = in_stack_fffffffffffffe98;
        sourceRange.startLoc = in_stack_fffffffffffffe90;
        ASTContext::addDiag(in_stack_fffffffffffffe88,code,sourceRange);
      }
    }
    else {
      if (SVar4 == ExpectPropertyStatement) goto LAB_0078637f;
      if (SVar4 == ExpressionStatement) {
        slang::syntax::SyntaxNode::as<slang::syntax::ExpressionStatementSyntax>
                  ((SyntaxNode *)syntax_00);
        local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                  ExpressionStatement::fromSyntax
                            (in_stack_ffffffffffffff58,
                             (ExpressionStatementSyntax *)CONCAT44(SVar4,in_stack_ffffffffffffff50),
                             in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      }
      else if (SVar4 == ForLoopStatement) {
        local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                  StatementContext::tryGetBlock
                            ((StatementContext *)in_stack_fffffffffffffe98,
                             (ASTContext *)in_stack_fffffffffffffe90,
                             (SyntaxNode *)in_stack_fffffffffffffe88);
        if (local_8 != (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)0x0) goto LAB_0078653c;
        slang::syntax::SyntaxNode::as<slang::syntax::ForLoopStatementSyntax>
                  ((SyntaxNode *)syntax_00);
        local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                  ForLoopStatement::fromSyntax
                            (in_stack_00000298,in_stack_00000290,in_stack_00000288,in_stack_00000280
                            );
      }
      else if (SVar4 == ForeachLoopStatement) {
        local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                  StatementContext::tryGetBlock
                            ((StatementContext *)in_stack_fffffffffffffe98,
                             (ASTContext *)in_stack_fffffffffffffe90,
                             (SyntaxNode *)in_stack_fffffffffffffe88);
        if (local_8 != (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)0x0) goto LAB_0078653c;
        slang::syntax::SyntaxNode::as<slang::syntax::ForeachLoopStatementSyntax>
                  ((SyntaxNode *)syntax_00);
        local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                  ForeachLoopStatement::fromSyntax
                            ((Compilation *)block_3,(ForeachLoopStatementSyntax *)block_4,
                             (ASTContext *)in_stack_000000f8,(StatementContext *)in_stack_000000f0);
      }
      else if (SVar4 == ForeverStatement) {
        slang::syntax::SyntaxNode::as<slang::syntax::ForeverStatementSyntax>
                  ((SyntaxNode *)syntax_00);
        local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                  ForeverLoopStatement::fromSyntax
                            (in_stack_ffffffffffffff18,
                             (ForeverStatementSyntax *)in_stack_ffffffffffffff10,
                             (ASTContext *)in_stack_ffffffffffffff08,(StatementContext *)stmtCtx);
      }
      else if ((SVar4 == ImmediateAssertStatement) || (SVar4 - ImmediateAssumeStatement < 2)) {
        slang::syntax::SyntaxNode::as<slang::syntax::ImmediateAssertionStatementSyntax>
                  ((SyntaxNode *)syntax_00);
        local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                  ImmediateAssertionStatement::fromSyntax
                            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             (ASTContext *)in_stack_ffffffffffffff08,
                             (StatementContext *)in_stack_ffffffffffffff00);
        in_stack_fffffffffffffed8 = stmtCtx;
      }
      else if (SVar4 == JumpStatement) {
        pJVar2 = slang::syntax::SyntaxNode::as<slang::syntax::JumpStatementSyntax>
                           ((SyntaxNode *)syntax_00);
        if ((pJVar2->breakOrContinue).kind == BreakKeyword) {
          local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                    BreakStatement::fromSyntax
                              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                               (ASTContext *)in_stack_fffffffffffffeb8,
                               (StatementContext *)in_stack_fffffffffffffeb0);
        }
        else {
          local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                    ContinueStatement::fromSyntax
                              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                               (ASTContext *)in_stack_fffffffffffffeb8,
                               (StatementContext *)in_stack_fffffffffffffeb0);
        }
      }
      else if (SVar4 == LoopStatement) {
        pLVar3 = slang::syntax::SyntaxNode::as<slang::syntax::LoopStatementSyntax>
                           ((SyntaxNode *)syntax_00);
        if ((pLVar3->repeatOrWhile).kind == RepeatKeyword) {
          local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                    RepeatLoopStatement::fromSyntax
                              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                               (ASTContext *)in_stack_ffffffffffffff68,
                               (StatementContext *)in_stack_ffffffffffffff60);
        }
        else {
          local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                    WhileLoopStatement::fromSyntax
                              (in_stack_ffffffffffffff58,
                               (LoopStatementSyntax *)CONCAT44(SVar4,in_stack_ffffffffffffff50),
                               in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
        }
      }
      else {
        if (SVar4 == NonblockingEventTriggerStatement) goto LAB_007862c3;
        if (SVar4 == ParallelBlockStatement) {
LAB_007860b1:
          local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                    StatementContext::tryGetBlock
                              ((StatementContext *)in_stack_fffffffffffffe98,
                               (ASTContext *)in_stack_fffffffffffffe90,
                               (SyntaxNode *)in_stack_fffffffffffffe88);
          if (local_8 != (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)0x0)
          goto LAB_0078653c;
          slang::syntax::SyntaxNode::as<slang::syntax::BlockStatementSyntax>
                    ((SyntaxNode *)syntax_00);
          local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                    BlockStatement::fromSyntax
                              (in_stack_00000038,in_stack_00000030,(ASTContext *)in_stack_00000028,
                               (StatementContext *)in_stack_00000020,in_stack_0000001f);
        }
        else if (SVar4 == ProceduralAssignStatement) {
LAB_00786307:
          slang::syntax::SyntaxNode::as<slang::syntax::ProceduralAssignStatementSyntax>
                    ((SyntaxNode *)syntax_00);
          local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                    ProceduralAssignStatement::fromSyntax
                              (in_stack_ffffffffffffff08,
                               (ProceduralAssignStatementSyntax *)in_stack_ffffffffffffff00,
                               in_stack_fffffffffffffef8);
        }
        else {
          if (SVar4 != ProceduralDeassignStatement) {
            if (SVar4 == ProceduralForceStatement) goto LAB_00786307;
            if (SVar4 != ProceduralReleaseStatement) {
              if (SVar4 == RandCaseStatement) {
                slang::syntax::SyntaxNode::as<slang::syntax::RandCaseStatementSyntax>
                          ((SyntaxNode *)syntax_00);
                local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                          RandCaseStatement::fromSyntax
                                    ((Compilation *)CONCAT17(in_stack_0000001f,in_stack_00000018),
                                     in_stack_00000010,in_stack_00000008,unaff_retaddr);
              }
              else if (SVar4 == RandSequenceStatement) {
                local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                          StatementContext::tryGetBlock
                                    ((StatementContext *)in_stack_fffffffffffffe98,
                                     (ASTContext *)in_stack_fffffffffffffe90,
                                     (SyntaxNode *)in_stack_fffffffffffffe88);
                if (local_8 != (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)0x0)
                goto LAB_0078653c;
                slang::syntax::SyntaxNode::as<slang::syntax::RandSequenceStatementSyntax>
                          ((SyntaxNode *)syntax_00);
                local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                          RandSequenceStatement::fromSyntax
                                    ((Compilation *)block_4,in_stack_000000f8,in_stack_000000f0);
              }
              else {
                if (SVar4 == RestrictPropertyStatement) goto LAB_0078637f;
                if (SVar4 == ReturnStatement) {
                  slang::syntax::SyntaxNode::as<slang::syntax::ReturnStatementSyntax>
                            ((SyntaxNode *)syntax_00);
                  local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                            ReturnStatement::fromSyntax
                                      (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                                       (ASTContext *)in_stack_ffffffffffffff58,
                                       (StatementContext *)CONCAT44(SVar4,in_stack_ffffffffffffff50)
                                      );
                }
                else {
                  if (SVar4 == SequentialBlockStatement) goto LAB_007860b1;
                  if (SVar4 == TimingControlStatement) {
                    slang::syntax::SyntaxNode::as<slang::syntax::TimingControlStatementSyntax>
                              ((SyntaxNode *)syntax_00);
                    local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                              TimedStatement::fromSyntax
                                        (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                                         (ASTContext *)in_stack_fffffffffffffea8,
                                         (StatementContext *)in_stack_fffffffffffffea0);
                    in_stack_fffffffffffffee0._M_extent_value = (size_t)stmtCtx;
                  }
                  else if (SVar4 == VoidCastedCallStatement) {
                    slang::syntax::SyntaxNode::as<slang::syntax::VoidCastedCallStatementSyntax>
                              ((SyntaxNode *)syntax_00);
                    local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                              ExpressionStatement::fromSyntax
                                        (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                         in_stack_fffffffffffffef8);
                  }
                  else if (SVar4 == WaitForkStatement) {
                    slang::syntax::SyntaxNode::as<slang::syntax::WaitForkStatementSyntax>
                              ((SyntaxNode *)syntax_00);
                    local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                              WaitForkStatement::fromSyntax
                                        (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                                         (ASTContext *)in_stack_fffffffffffffe98);
                  }
                  else if (SVar4 == WaitOrderStatement) {
                    slang::syntax::SyntaxNode::as<slang::syntax::WaitOrderStatementSyntax>
                              ((SyntaxNode *)syntax_00);
                    local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                              WaitOrderStatement::fromSyntax
                                        (in_stack_00000088,in_stack_00000080,in_stack_00000078,
                                         in_stack_00000070);
                  }
                  else {
                    slang::syntax::SyntaxNode::as<slang::syntax::WaitStatementSyntax>
                              ((SyntaxNode *)syntax_00);
                    local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                              WaitStatement::fromSyntax
                                        (in_stack_fffffffffffffee8,
                                         (WaitStatementSyntax *)
                                         in_stack_fffffffffffffee0._M_extent_value,
                                         (ASTContext *)in_stack_fffffffffffffed8,
                                         (StatementContext *)in_stack_fffffffffffffed0);
                    in_stack_fffffffffffffec8 = stmtCtx;
                  }
                }
              }
              goto LAB_007864c6;
            }
          }
          slang::syntax::SyntaxNode::as<slang::syntax::ProceduralDeassignStatementSyntax>
                    ((SyntaxNode *)syntax_00);
          local_8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                    ProceduralDeassignStatement::fromSyntax
                              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                               (ASTContext *)in_stack_ffffffffffffff18);
        }
      }
    }
  }
LAB_007864c6:
  *(StatementSyntax **)&(local_8->super_SyntaxListBase).super_SyntaxNode = syntax_00;
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
             in_stack_fffffffffffffe80,local_8);
  syntax._M_extent._M_extent_value = in_stack_fffffffffffffee0._M_extent_value;
  syntax._M_ptr = (pointer)in_stack_fffffffffffffed8;
  ASTContext::setAttributes
            ((ASTContext *)in_stack_fffffffffffffed0,(Statement *)in_stack_fffffffffffffec8,syntax);
LAB_0078653c:
  return (int)local_8;
}

Assistant:

const Statement& Statement::bind(const StatementSyntax& syntax, const ASTContext& context,
                                 StatementContext& stmtCtx, bool inList, bool labelHandled) {
    auto& comp = context.getCompilation();

    if (!labelHandled && hasSimpleLabel(syntax)) {
        auto block = stmtCtx.tryGetBlock(context, syntax);
        SLANG_ASSERT(block);
        return *block;
    }

    Statement* result;
    switch (syntax.kind) {
        case SyntaxKind::EmptyStatement:
            result = comp.emplace<EmptyStatement>(syntax.sourceRange());
            if (inList && syntax.attributes.empty())
                context.addDiag(diag::EmptyStatement, syntax.sourceRange());
            break;
        case SyntaxKind::ReturnStatement:
            result = &ReturnStatement::fromSyntax(comp, syntax.as<ReturnStatementSyntax>(), context,
                                                  stmtCtx);
            break;
        case SyntaxKind::JumpStatement: {
            auto& jump = syntax.as<JumpStatementSyntax>();
            if (jump.breakOrContinue.kind == TokenKind::BreakKeyword)
                result = &BreakStatement::fromSyntax(comp, jump, context, stmtCtx);
            else
                result = &ContinueStatement::fromSyntax(comp, jump, context, stmtCtx);
            break;
        }
        case SyntaxKind::DisableStatement:
            result = &DisableStatement::fromSyntax(comp, syntax.as<DisableStatementSyntax>(),
                                                   context);
            break;
        case SyntaxKind::ConditionalStatement:
            result = &ConditionalStatement::fromSyntax(comp,
                                                       syntax.as<ConditionalStatementSyntax>(),
                                                       context, stmtCtx);
            break;
        case SyntaxKind::CaseStatement:
            result = &CaseStatement::fromSyntax(comp, syntax.as<CaseStatementSyntax>(), context,
                                                stmtCtx);
            break;
        case SyntaxKind::ForLoopStatement:
            // We might have an implicit block here; check for that first.
            if (auto block = stmtCtx.tryGetBlock(context, syntax))
                return *block;

            result = &ForLoopStatement::fromSyntax(comp, syntax.as<ForLoopStatementSyntax>(),
                                                   context, stmtCtx);
            break;
        case SyntaxKind::LoopStatement: {
            auto& loop = syntax.as<LoopStatementSyntax>();
            if (loop.repeatOrWhile.kind == TokenKind::RepeatKeyword)
                result = &RepeatLoopStatement::fromSyntax(comp, loop, context, stmtCtx);
            else
                result = &WhileLoopStatement::fromSyntax(comp, loop, context, stmtCtx);
            break;
        }
        case SyntaxKind::ForeachLoopStatement:
            // We might have an implicit block here; check for that first.
            if (auto block = stmtCtx.tryGetBlock(context, syntax))
                return *block;

            result = &ForeachLoopStatement::fromSyntax(comp,
                                                       syntax.as<ForeachLoopStatementSyntax>(),
                                                       context, stmtCtx);
            break;
        case SyntaxKind::DoWhileStatement:
            result = &DoWhileLoopStatement::fromSyntax(comp, syntax.as<DoWhileStatementSyntax>(),
                                                       context, stmtCtx);
            break;
        case SyntaxKind::ForeverStatement:
            result = &ForeverLoopStatement::fromSyntax(comp, syntax.as<ForeverStatementSyntax>(),
                                                       context, stmtCtx);
            break;
        case SyntaxKind::ExpressionStatement:
            result = &ExpressionStatement::fromSyntax(comp, syntax.as<ExpressionStatementSyntax>(),
                                                      context, stmtCtx);
            break;
        case SyntaxKind::VoidCastedCallStatement:
            result = &ExpressionStatement::fromSyntax(comp,
                                                      syntax.as<VoidCastedCallStatementSyntax>(),
                                                      context);
            break;
        case SyntaxKind::SequentialBlockStatement:
        case SyntaxKind::ParallelBlockStatement:
            // A block statement may or may not match up with a hierarchy node. Handle both cases
            // here. We traverse statements in the same order as the findBlocks call below, so this
            // should always sync up exactly.
            if (auto block = stmtCtx.tryGetBlock(context, syntax))
                return *block;

            result = &BlockStatement::fromSyntax(comp, syntax.as<BlockStatementSyntax>(), context,
                                                 stmtCtx);
            break;
        case SyntaxKind::TimingControlStatement:
            result = &TimedStatement::fromSyntax(comp, syntax.as<TimingControlStatementSyntax>(),
                                                 context, stmtCtx);
            break;
        case SyntaxKind::ImmediateAssertStatement:
        case SyntaxKind::ImmediateAssumeStatement:
        case SyntaxKind::ImmediateCoverStatement:
            result = &ImmediateAssertionStatement::fromSyntax(
                comp, syntax.as<ImmediateAssertionStatementSyntax>(), context, stmtCtx);
            break;
        case SyntaxKind::DisableForkStatement:
            result = &DisableForkStatement::fromSyntax(comp,
                                                       syntax.as<DisableForkStatementSyntax>());
            break;
        case SyntaxKind::WaitStatement:
            result = &WaitStatement::fromSyntax(comp, syntax.as<WaitStatementSyntax>(), context,
                                                stmtCtx);
            break;
        case SyntaxKind::WaitForkStatement:
            result = &WaitForkStatement::fromSyntax(comp, syntax.as<WaitForkStatementSyntax>(),
                                                    context);
            break;
        case SyntaxKind::WaitOrderStatement:
            result = &WaitOrderStatement::fromSyntax(comp, syntax.as<WaitOrderStatementSyntax>(),
                                                     context, stmtCtx);
            break;
        case SyntaxKind::BlockingEventTriggerStatement:
        case SyntaxKind::NonblockingEventTriggerStatement:
            result = &EventTriggerStatement::fromSyntax(comp,
                                                        syntax.as<EventTriggerStatementSyntax>(),
                                                        context, stmtCtx);
            break;
        case SyntaxKind::ProceduralAssignStatement:
        case SyntaxKind::ProceduralForceStatement:
            result = &ProceduralAssignStatement::fromSyntax(
                comp, syntax.as<ProceduralAssignStatementSyntax>(), context);
            break;
        case SyntaxKind::ProceduralDeassignStatement:
        case SyntaxKind::ProceduralReleaseStatement:
            result = &ProceduralDeassignStatement::fromSyntax(
                comp, syntax.as<ProceduralDeassignStatementSyntax>(), context);
            break;
        case SyntaxKind::AssertPropertyStatement:
        case SyntaxKind::AssumePropertyStatement:
        case SyntaxKind::CoverPropertyStatement:
        case SyntaxKind::ExpectPropertyStatement:
        case SyntaxKind::CoverSequenceStatement:
        case SyntaxKind::RestrictPropertyStatement:
            result = &ConcurrentAssertionStatement::fromSyntax(
                comp, syntax.as<ConcurrentAssertionStatementSyntax>(), context, stmtCtx);
            break;
        case SyntaxKind::RandCaseStatement:
            result = &RandCaseStatement::fromSyntax(comp, syntax.as<RandCaseStatementSyntax>(),
                                                    context, stmtCtx);
            break;
        case SyntaxKind::RandSequenceStatement:
            // We might have an implicit block here; check for that first.
            if (auto block = stmtCtx.tryGetBlock(context, syntax))
                return *block;

            result = &RandSequenceStatement::fromSyntax(comp,
                                                        syntax.as<RandSequenceStatementSyntax>(),
                                                        context);
            break;
        case SyntaxKind::CheckerInstanceStatement:
            result = &ProceduralCheckerStatement::fromSyntax(
                comp, syntax.as<CheckerInstanceStatementSyntax>(), context, stmtCtx);
            break;
        default:
            SLANG_UNREACHABLE;
    }

    result->syntax = &syntax;
    context.setAttributes(*result, syntax.attributes);
    return *result;
}